

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O0

int Separated(BoundingBox *a,BoundingBox *b)

{
  double *pdVar1;
  double dVar2;
  BoundingBox *b_local;
  BoundingBox *a_local;
  int local_4;
  
  dVar2 = (a->TL).Pos[0] - 2.0;
  if (dVar2 < (b->BR).Pos[0] || dVar2 == (b->BR).Pos[0]) {
    dVar2 = (a->TL).Pos[1] - 2.0;
    pdVar1 = (b->BR).Pos + 1;
    if (dVar2 < *pdVar1 || dVar2 == *pdVar1) {
      dVar2 = (b->TL).Pos[0] - 2.0;
      if (dVar2 < (a->BR).Pos[0] || dVar2 == (a->BR).Pos[0]) {
        dVar2 = (b->TL).Pos[1] - 2.0;
        pdVar1 = (a->BR).Pos + 1;
        if (dVar2 < *pdVar1 || dVar2 == *pdVar1) {
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int Separated(struct BoundingBox *a, struct BoundingBox *b)
{
   if (a->TL.Pos[0] - ERROR_BOUNDARY > b->BR.Pos[0])
      return true;
   if (a->TL.Pos[1] - ERROR_BOUNDARY > b->BR.Pos[1])
      return true;

   if (b->TL.Pos[0] - ERROR_BOUNDARY > a->BR.Pos[0])
      return true;
   if (b->TL.Pos[1] - ERROR_BOUNDARY > a->BR.Pos[1])
      return true;

   return false;
}